

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void __thiscall AWeapon::CallEndPowerup(AWeapon *this)

{
  VMFunction *func;
  PNativeStruct *pPVar1;
  int iVar2;
  DObject *p;
  PFunction *pPVar3;
  PClass *pPVar4;
  undefined8 *in_FS_OFFSET;
  VMValue params [1];
  anon_union_16_5_cf148060_for_VMValue_0 local_28;
  undefined4 extraout_var;
  
  if (CallEndPowerup::VIndex == 0xffffffff) {
    pPVar1 = &(RegistrationInfo.MyClass)->super_PNativeStruct;
    iVar2 = FName::NameManager::FindName(&FName::NameData,"EndPowerup",false);
    local_28.i = iVar2;
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Symbols
                   ,(FName *)&local_28.field_1,false);
    pPVar3 = dyn_cast<PFunction>(p);
    if (pPVar3 == (PFunction *)0x0) {
      __assert_fail("sym != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./virtual.h"
                    ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
    }
    CallEndPowerup::VIndex = ((pPVar3->Variants).Array)->Implementation->VirtualIndex;
    if (CallEndPowerup::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x33d,"void AWeapon::CallEndPowerup()");
    }
  }
  pPVar4 = (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
           Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject._vptr_DObject)(this);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.Class =
         pPVar4;
  }
  if ((CallEndPowerup::VIndex < (pPVar4->Virtuals).Count) &&
     (func = (pPVar4->Virtuals).Array[CallEndPowerup::VIndex], func != (VMFunction *)0x0)) {
    local_28.field_1.atag = 1;
    local_28.field_3.Type = '\x03';
    local_28.field_1.a = this;
    GlobalVMStack::__tls_init();
    VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,func,(VMValue *)&local_28.field_1,1,
                       (VMReturn *)0x0,0,(VMException **)0x0);
    if (local_28.field_3.Type == '\x02') {
      FString::~FString((FString *)&local_28.field_1);
    }
  }
  else {
    (*(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[0x31])(this);
  }
  return;
}

Assistant:

void AWeapon::CallEndPowerup()
{
	IFVIRTUAL(AWeapon, EndPowerup)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}
	else EndPowerup();
}